

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O1

void __thiscall OpenMD::BondAngleDistribution::process(BondAngleDistribution *this)

{
  double *pdVar1;
  int *piVar2;
  double dVar3;
  pointer pOVar4;
  char cVar5;
  SimInfo *info;
  double dVar6;
  uint i_1;
  int iVar7;
  StuntDouble *pSVar8;
  Molecule *pMVar9;
  Atom *pAVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  pointer ppAVar16;
  ulong uVar17;
  ulong uVar18;
  double tmp;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> bondvec;
  int i;
  MoleculeIterator mi;
  Vector3d vec;
  DumpReader reader;
  SelectionSet local_1358;
  ulong local_1340;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1338;
  int local_1314;
  int local_1310;
  int local_130c;
  double local_1308 [4];
  SelectionManager *local_12e8;
  MoleculeIterator local_12e0;
  Vector3d local_12d8;
  SelectionEvaluator *local_12c0;
  ulong local_12b8;
  StuntDouble *local_12b0;
  double local_12a8 [4];
  DumpReader local_1288;
  
  local_12e0._M_node = (_Base_ptr)0x0;
  local_12d8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_12d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_12d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1338.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1338.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1338.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar5 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar7 = DumpReader::getNFrames(&local_1288);
  uVar14 = 0;
  this->frameCounter_ = 0;
  this->nTotBonds_ = 0;
  if (0 < iVar7) {
    local_12c0 = &this->evaluator_;
    local_12e8 = &this->seleMan_;
    local_1314 = iVar7;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar14);
      this->frameCounter_ = this->frameCounter_ + 1;
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1358,local_12c0);
        lVar15 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar15),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1358.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar15));
          lVar15 = lVar15 + 0x28;
        } while (lVar15 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1358.bitsets_);
      }
      pSVar8 = SelectionManager::beginSelected(local_12e8,&local_130c);
      local_12b8 = uVar14;
      while (pSVar8 != (StuntDouble *)0x0) {
        if (local_1338.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_1338.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_1338.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_1338.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        local_1310 = pSVar8->globalIndex_;
        pMVar9 = SimInfo::beginMolecule((this->super_StaticAnalyser).info_,&local_12e0);
        local_1340 = 0;
        local_12b0 = pSVar8;
        while (pMVar9 != (Molecule *)0x0) {
          ppAVar16 = (pMVar9->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (ppAVar16 !=
              (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_0012dd9c;
LAB_0012dc50:
          pAVar10 = (Atom *)0x0;
          while (pAVar10 != (Atom *)0x0) {
            if ((pAVar10->super_StuntDouble).globalIndex_ != local_1310) {
              lVar15 = *(long *)((long)&(local_12b0->snapshotMan_->currentSnapshot_->atomData).
                                        position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                local_12b0->storage_);
              local_1308[2] = *(double *)(lVar15 + 0x10 + (long)local_12b0->localIndex_ * 0x18);
              pdVar1 = (double *)(lVar15 + (long)local_12b0->localIndex_ * 0x18);
              local_1308[0] = *pdVar1;
              local_1308[1] = pdVar1[1];
              lVar11 = (long)(pAVar10->super_StuntDouble).localIndex_;
              lVar15 = *(long *)((long)&(((pAVar10->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar10->super_StuntDouble).storage_);
              local_12a8[2] = (double)*(undefined8 *)(lVar15 + 0x10 + lVar11 * 0x18);
              pdVar1 = (double *)(lVar15 + lVar11 * 0x18);
              local_12a8[0] = *pdVar1;
              local_12a8[1] = pdVar1[1];
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              lVar15 = 0;
              do {
                (&local_1358.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar15] =
                     (pointer)(local_1308[lVar15] - local_12a8[lVar15]);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              local_12d8.super_Vector<double,_3U>.data_[2] =
                   (double)local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_12d8.super_Vector<double,_3U>.data_[0] =
                   (double)local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              local_12d8.super_Vector<double,_3U>.data_[1] =
                   (double)local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              if (cVar5 != '\0') {
                Snapshot::wrapVector(this->currentSnapshot_,&local_12d8);
              }
              dVar6 = 0.0;
              lVar15 = 0;
              do {
                dVar3 = local_12d8.super_Vector<double,_3U>.data_[lVar15];
                dVar6 = dVar6 + dVar3 * dVar3;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              if (dVar6 < this->rCut_) {
                std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                push_back(&local_1338,&local_12d8);
                local_1340 = (ulong)((int)local_1340 + 1);
                this->nTotBonds_ = this->nTotBonds_ + 1;
              }
            }
            ppAVar16 = ppAVar16 + 1;
            if (ppAVar16 ==
                (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0012dc50;
LAB_0012dd9c:
            pAVar10 = *ppAVar16;
          }
          if (1 < (int)local_1340) {
            uVar13 = (int)local_1340 - 1;
            uVar18 = local_1340 & 0xffffffff;
            uVar14 = 1;
            uVar17 = 0;
            do {
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_1338.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super_Vector<double,_3U>.data_[0];
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_1338.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super_Vector<double,_3U>.data_[1];
              local_1358.bitsets_.
              super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_1338.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                            super_Vector<double,_3U>.data_[2];
              dVar6 = 0.0;
              lVar15 = 0;
              do {
                pOVar4 = (&local_1358.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)[lVar15];
                dVar6 = dVar6 + (double)pOVar4 * (double)pOVar4;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              lVar15 = 0;
              do {
                (&local_1358.bitsets_.
                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                  _M_impl.super__Vector_impl_data._M_start)[lVar15] =
                     (pointer)((double)(&local_1358.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)[lVar15] / dVar6)
                ;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              uVar17 = uVar17 + 1;
              uVar12 = uVar14;
              do {
                local_1308[0] =
                     local_1338.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].super_Vector<double,_3U>.
                     data_[0];
                local_1308[1] =
                     local_1338.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].super_Vector<double,_3U>.
                     data_[1];
                local_1308[2] =
                     local_1338.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].super_Vector<double,_3U>.
                     data_[2];
                dVar6 = 0.0;
                lVar15 = 0;
                do {
                  dVar6 = dVar6 + local_1308[lVar15] * local_1308[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                if (dVar6 < 0.0) {
                  dVar6 = sqrt(dVar6);
                }
                else {
                  dVar6 = SQRT(dVar6);
                }
                lVar15 = 0;
                do {
                  local_1308[lVar15] = local_1308[lVar15] / dVar6;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                dVar6 = 0.0;
                lVar15 = 0;
                do {
                  dVar6 = dVar6 + (double)(&local_1358.bitsets_.
                                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                            ._M_impl.super__Vector_impl_data._M_start)[lVar15] *
                                  local_1308[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                dVar6 = acos(dVar6);
                dVar6 = (dVar6 * 180.0) / 3.141592653589793;
                piVar2 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start +
                         (int)((double)(~-(ulong)(180.0 < dVar6) & (ulong)dVar6 |
                                       (ulong)(360.0 - dVar6) & -(ulong)(180.0 < dVar6)) /
                              this->deltaTheta_);
                *piVar2 = *piVar2 + 2;
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar18);
              uVar14 = uVar14 + 1;
            } while (uVar17 != uVar13);
          }
          pMVar9 = SimInfo::nextMolecule((this->super_StaticAnalyser).info_,&local_12e0);
        }
        pSVar8 = SelectionManager::nextSelected(local_12e8,&local_130c);
      }
      uVar13 = (int)local_12b8 + (this->super_StaticAnalyser).step_;
      uVar14 = (ulong)uVar13;
    } while ((int)uVar13 < local_1314);
  }
  writeBondAngleDistribution(this);
  DumpReader::~DumpReader(&local_1288);
  if (local_1338.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1338.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1338.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1338.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BondAngleDistribution::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    std::vector<Vector3d> bondvec;
    RealType r;
    int nBonds;
    int i;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    nTotBonds_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;
        bondvec.clear();

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and make a pair list

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                // Add neighbor to bond list's
                bondvec.push_back(vec);
                nBonds++;
                nTotBonds_++;
              }
            }
          }

          for (int i = 0; i < nBonds - 1; i++) {
            Vector3d vec1 = bondvec[i];
            vec1.normalize();
            for (int j = i + 1; j < nBonds; j++) {
              Vector3d vec2 = bondvec[j];

              vec2.normalize();

              RealType theta = acos(dot(vec1, vec2)) * 180.0 / Constants::PI;

              if (theta > 180.0) { theta = 360.0 - theta; }
              int whichBin = int(theta / deltaTheta_);

              histogram_[whichBin] += 2;
            }
          }
        }
      }
    }

    writeBondAngleDistribution();
  }